

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::ConditionalCase::init(ConditionalCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DecisionType DVar2;
  BranchResult BVar3;
  pointer pfVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  uint uVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  PerfCaseType PVar12;
  char *pcVar13;
  AttribSpec *__args;
  ostringstream *poVar14;
  long lVar15;
  ostringstream *stream;
  float fVar16;
  string condition;
  ostringstream vtx;
  ostringstream frag;
  Vec4 local_428;
  long local_418;
  long lStack_410;
  undefined8 local_408;
  float fStack_400;
  float fStack_3fc;
  long local_3f8;
  long lStack_3f0;
  ConditionalCase *local_3e0;
  AttribSpec local_3d8;
  Vec4 local_378;
  long local_368 [3];
  char *local_350;
  long local_348;
  char local_340;
  undefined7 uStack_33f;
  Vec4 local_330;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  PVar12 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  DVar2 = this->m_decisionType;
  BVar3 = this->m_branchType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  stream = (ostringstream *)local_1a8;
  if (PVar12 == CASETYPE_VERTEX) {
    stream = (ostringstream *)local_320;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute highp vec4 a_position;\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute mediump vec4 a_value0;\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"attribute mediump vec4 a_value1;\n",0x21);
  if (DVar2 - DECISION_UNIFORM < 2) {
    pcVar13 = "uniform mediump float u_compareValue;\n";
    poVar14 = stream;
    if (DVar2 == DECISION_ATTRIBUTE) {
      pcVar13 = "attribute mediump float a_compareValue;\n";
      poVar14 = (ostringstream *)local_320;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar14,pcVar13,(ulong)(DVar2 == DECISION_ATTRIBUTE) * 2 + 0x26);
  }
  if (PVar12 == CASETYPE_VERTEX) {
    lVar15 = 0x1e;
    pcVar13 = "varying mediump vec4 v_color;\n";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_color;\n",0x1e);
LAB_01001799:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar15);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_value0;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"varying mediump vec4 v_value1;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"varying mediump vec4 v_value0;\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"varying mediump vec4 v_value1;\n",0x1f);
    if (DVar2 == DECISION_ATTRIBUTE) {
      lVar15 = 0x26;
      pcVar13 = "varying mediump float v_compareValue;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"varying mediump float v_compareValue;\n",0x26);
      goto LAB_01001799;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\tmediump vec4 res;\n",0x13)
  ;
  local_350 = &local_340;
  local_348 = 0;
  local_340 = '\0';
  if (PVar12 == CASETYPE_VERTEX || BVar3 != BRANCH_MIXED) {
    local_3e0 = this;
    local_428.m_data._0_8_ = &local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,0x1b32ab9);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_428);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_3f8 = *plVar9;
      lStack_3f0 = plVar6[3];
      local_408 = &local_3f8;
    }
    else {
      local_3f8 = *plVar9;
      local_408 = (long *)*plVar6;
    }
    fStack_400 = (float)plVar6[1];
    fStack_3fc = (float)((ulong)plVar6[1] >> 0x20);
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_408);
    paVar1 = &local_3d8.name.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_3d8.name.field_2._M_allocated_capacity = *psVar10;
      local_3d8.name.field_2._8_8_ = plVar6[3];
      local_3d8.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3d8.name.field_2._M_allocated_capacity = *psVar10;
      local_3d8.name._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_3d8.name._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d8.name._M_dataplus._M_p,
                      local_3d8.name.field_2._M_allocated_capacity + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if ((long *)local_428.m_data._0_8_ != &local_418) {
      operator_delete((void *)local_428.m_data._0_8_,local_418 + 1);
    }
    this = local_3e0;
  }
  else {
    local_3e0 = (ConditionalCase *)CONCAT44(local_3e0._4_4_,PVar12);
    local_378.m_data._0_8_ = local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,0x1b32ab9);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_378);
    local_428.m_data._0_8_ = &local_418;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_418 = *plVar9;
      lStack_410 = plVar6[3];
    }
    else {
      local_418 = *plVar9;
      local_428.m_data._0_8_ = (long *)*plVar6;
    }
    local_428.m_data[2] = (float)plVar6[1];
    local_428.m_data[3] = (float)((ulong)plVar6[1] >> 0x20);
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_428);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_3f8 = *plVar9;
      lStack_3f0 = plVar6[3];
      local_408 = &local_3f8;
    }
    else {
      local_3f8 = *plVar9;
      local_408 = (long *)*plVar6;
    }
    fStack_400 = (float)plVar6[1];
    fStack_3fc = (float)((ulong)plVar6[1] >> 0x20);
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_408);
    paVar1 = &local_3d8.name.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_3d8.name.field_2._M_allocated_capacity = *psVar10;
      local_3d8.name.field_2._8_8_ = plVar6[3];
      local_3d8.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3d8.name.field_2._M_allocated_capacity = *psVar10;
      local_3d8.name._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_3d8.name._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d8.name._M_dataplus._M_p,
                      local_3d8.name.field_2._M_allocated_capacity + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if ((long *)local_428.m_data._0_8_ != &local_418) {
      operator_delete((void *)local_428.m_data._0_8_,local_418 + 1);
    }
    if ((long *)local_378.m_data._0_8_ != local_368) {
      operator_delete((void *)local_378.m_data._0_8_,local_368[0] + 1);
    }
    PVar12 = (PerfCaseType)local_3e0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\tif (",5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_350,local_348)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t\t",2);
  if (this->m_workloadDivision < WORKLOAD_DIVISION_FALSE_HEAVY) {
    pcVar13 = "v_value0";
    if (PVar12 == CASETYPE_VERTEX) {
      pcVar13 = "a_value0";
    }
    writeConditionalWorkload((ostringstream *)stream,"res",pcVar13);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"res = ",6);
    pcVar13 = "v_value0";
    if (PVar12 == CASETYPE_VERTEX) {
      pcVar13 = "a_value0";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,pcVar13,8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,";",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t\t",2);
  if ((this->m_workloadDivision & ~WORKLOAD_DIVISION_FALSE_HEAVY) == WORKLOAD_DIVISION_EVEN) {
    pcVar13 = "v_value1";
    if (PVar12 == CASETYPE_VERTEX) {
      pcVar13 = "a_value1";
    }
    writeConditionalWorkload((ostringstream *)stream,"res",pcVar13);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"res = ",6);
    pcVar13 = "v_value1";
    if (PVar12 == CASETYPE_VERTEX) {
      pcVar13 = "a_value1";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,pcVar13,8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,";",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"\t}\n",3);
  if (PVar12 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_color = res;\n",0x10);
    lVar15 = 0x19;
    pcVar13 = "\tgl_FragColor = v_color;\n";
  }
  else {
    if (DVar2 == DECISION_ATTRIBUTE) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tv_compareValue = a_compareValue;\n",0x22);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_value0 = a_value0;\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_value1 = a_value1;\n",0x16);
    lVar15 = 0x15;
    pcVar13 = "\tgl_FragColor = res;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&local_3d8);
  paVar1 = &local_3d8.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d8.name._M_dataplus._M_p,local_3d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d8.name._M_dataplus._M_p,local_3d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (DVar2 == DECISION_ATTRIBUTE) {
    if (BVar3 == BRANCH_MIXED) {
      if (PVar12 == CASETYPE_VERTEX) {
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_comparisonValueArray,
                   (long)(((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer
                           .m_gridSizeX * 4 + 4) *
                         ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                          m_gridSizeY + 1)));
        pfVar4 = (this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = (uint)((ulong)((long)(this->m_comparisonValueArray).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pfVar4) >> 2);
        if (0 < (int)uVar8) {
          uVar11 = 0;
          do {
            fVar16 = 0.0;
            if ((uVar11 & 3) == 0) {
              fVar16 = *(float *)(&DAT_01c00370 + (ulong)((uVar11 & 4) == 0) * 4);
            }
            pfVar4[uVar11] = fVar16;
            uVar11 = uVar11 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar11);
        }
        goto LAB_01001fc5;
      }
      local_428.m_data[0] =
           (float)(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                  m_viewportWidth * 0.5;
      local_408._0_4_ = 0.0;
      local_408._4_4_ = 0.0;
      fStack_400 = 0.0;
      fStack_3fc = 0.0;
      local_428.m_data[1] = 0.0;
      local_428.m_data[2] = 0.0;
      local_428.m_data[3] = 0.0;
      local_378.m_data[0] = 0.0;
      local_378.m_data[1] = 0.0;
      local_378.m_data[2] = 0.0;
      local_378.m_data[3] = 0.0;
      local_330.m_data[1] = 0.0;
      local_330.m_data[2] = 0.0;
      local_330.m_data[3] = 0.0;
      local_330.m_data[0] = local_428.m_data[0];
      deqp::gls::AttribSpec::AttribSpec
                (&local_3d8,"a_compareValue",(Vec4 *)&local_408,&local_428,&local_378,&local_330);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3d8);
    }
    else {
      local_428.m_data[0] = *(float *)(&DAT_01c00370 + (ulong)(BVar3 == BRANCH_TRUE) * 4);
      local_408._4_4_ = 0.0;
      fStack_400 = 0.0;
      fStack_3fc = 0.0;
      local_428.m_data[1] = 0.0;
      local_428.m_data[2] = 0.0;
      local_428.m_data[3] = 0.0;
      local_378.m_data[1] = 0.0;
      local_378.m_data[2] = 0.0;
      local_378.m_data[3] = 0.0;
      local_330.m_data[1] = 0.0;
      local_330.m_data[2] = 0.0;
      local_330.m_data[3] = 0.0;
      local_408._0_4_ = local_428.m_data[0];
      local_378.m_data[0] = local_428.m_data[0];
      local_330.m_data[0] = local_428.m_data[0];
      deqp::gls::AttribSpec::AttribSpec
                (&local_3d8,"a_compareValue",(Vec4 *)&local_408,&local_428,&local_378,&local_330);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_3d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d8.name._M_dataplus._M_p,
                      local_3d8.name.field_2._M_allocated_capacity + 1);
    }
  }
LAB_01001fc5:
  local_408._0_4_ = 0.0;
  local_408._4_4_ = 0.1;
  fStack_400 = 0.2;
  fStack_3fc = 0.3;
  local_428.m_data[0] = 0.4;
  local_428.m_data[1] = 0.5;
  local_428.m_data[2] = 0.6;
  local_428.m_data[3] = 0.7;
  local_378.m_data[0] = 0.8;
  local_378.m_data[1] = 0.9;
  local_378.m_data[2] = 1.0;
  local_378.m_data[3] = 1.1;
  local_330.m_data[0] = 1.2;
  local_330.m_data[1] = 1.3;
  local_330.m_data[2] = 1.4;
  local_330.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_3d8,"a_value0",(Vec4 *)&local_408,&local_428,&local_378,&local_330);
  this_00 = &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>(this_00,&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d8.name._M_dataplus._M_p,local_3d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_408._0_4_ = 0.0;
  local_408._4_4_ = 0.1;
  fStack_400 = 0.2;
  fStack_3fc = 0.3;
  local_428.m_data[0] = 0.4;
  local_428.m_data[1] = 0.5;
  local_428.m_data[2] = 0.6;
  local_428.m_data[3] = 0.7;
  local_378.m_data[0] = 0.8;
  local_378.m_data[1] = 0.9;
  local_378.m_data[2] = 1.0;
  local_378.m_data[3] = 1.1;
  local_330.m_data[0] = 1.2;
  local_330.m_data[1] = 1.3;
  local_330.m_data[2] = 1.4;
  local_330.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_3d8,"a_value1",(Vec4 *)&local_408,&local_428,&local_378,&local_330);
  __args = &local_3d8;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>(this_00,__args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name._M_dataplus._M_p != paVar1) {
    __args = (AttribSpec *)(local_3d8.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3d8.name._M_dataplus._M_p,(ulong)__args);
  }
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__args);
  if (local_350 != &local_340) {
    operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  iVar5 = std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return iVar5;
}

Assistant:

void ConditionalCase::init (void)
{
	bool			isVertexCase		= m_caseType == CASETYPE_VERTEX;

	bool			isStaticCase		= m_decisionType == DECISION_STATIC;
	bool			isUniformCase		= m_decisionType == DECISION_UNIFORM;
	bool			isAttributeCase		= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	bool			isConditionTrue		= m_branchType == BRANCH_TRUE;
	bool			isConditionFalse	= m_branchType == BRANCH_FALSE;
	bool			isConditionMixed	= m_branchType == BRANCH_MIXED;

	DE_ASSERT(isConditionTrue || isConditionFalse || isConditionMixed);
	DE_UNREF(isConditionFalse);

	DE_ASSERT(isAttributeCase || !isConditionMixed); // The branch taken can vary between executions only if using attribute input.

	const char*		staticCompareValueStr	= isConditionTrue	? "1.0" : "-1.0";
	const char*		compareValueStr			= isStaticCase		? staticCompareValueStr :
											  isUniformCase		? "u_compareValue" :
											  isVertexCase		? "a_compareValue" :
																  "v_compareValue";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";	// Position attribute.
	vtx << "attribute mediump vec4 a_value0;\n";	// Input for workload calculations of "true" branch.
	vtx << "attribute mediump vec4 a_value1;\n";	// Input for workload calculations of "false" branch.

	// Value to be used in the conditional expression.
	if (isAttributeCase)
		vtx << "attribute mediump float a_compareValue;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_compareValue;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_value0;\n";
		vtx << "varying mediump vec4 v_value1;\n";
		frag << "varying mediump vec4 v_value0;\n";
		frag << "varying mediump vec4 v_value1;\n";

		if (isAttributeCase)
		{
			vtx << "varying mediump float v_compareValue;\n";
			frag << "varying mediump float v_compareValue;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res;\n";

	string condition;

	if (isConditionMixed && !isVertexCase)
		condition = string("") + "fract(" + compareValueStr + ") < 0.5"; // Comparison result varies with high frequency.
	else
		condition = string("") + compareValueStr + " > 0.0";

	op << "	if (" << condition << ")\n";
	op << "	{\n";

	op << "\t\t";
	if (m_workloadDivision == WORKLOAD_DIVISION_EVEN || m_workloadDivision == WORKLOAD_DIVISION_TRUE_HEAVY)
		writeConditionalWorkload(op, "res", isVertexCase ? "a_value0" : "v_value0"); // Workload calculation for the "true" branch.
	else
		op << "res = " << (isVertexCase ? "a_value0" : "v_value0") << ";";
	op << "\n";

	op << "	}\n";
	op << "	else\n";
	op << "	{\n";

	op << "\t\t";
	if (m_workloadDivision == WORKLOAD_DIVISION_EVEN || m_workloadDivision == WORKLOAD_DIVISION_FALSE_HEAVY)
		writeConditionalWorkload(op, "res", isVertexCase ? "a_value1" : "v_value1"); // Workload calculations for the "false" branch.
	else
		op << "res = " << (isVertexCase ? "a_value1" : "v_value1") << ";";
	op << "\n";

	op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_compareValue = a_compareValue;\n";
		vtx << "	v_value0 = a_value0;\n";
		vtx << "	v_value1 = a_value1;\n";

		frag << "	gl_FragColor = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (!isConditionMixed)
		{
			// Every execution takes the same branch.

			float value = isConditionTrue ? +1.0f : -1.0f;
			m_attributes.push_back(AttribSpec("a_compareValue",	Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f),
																Vec4(value, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, not every execution takes the same branch.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_comparisonValueArray.resize(numVertices * numComponents);

			// Make every second vertex take the true branch, and every second the false branch.
			for (int i = 0; i < (int)m_comparisonValueArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_comparisonValueArray[i] = (i / numComponents) % 2 == 0 ? +1.0f : -1.0f;
				else
					m_comparisonValueArray[i] = 0.0f;
			}
		}
		else // isConditionMixed && !isVertexCase
		{
			// Fragment case, not every execution takes the same branch.
			// \note fract(a_compareValue) < 0.5 will be true for every second column of fragments.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_compareValue",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
																Vec4(maxValue, 0.0f, 0.0f, 0.0f),
																Vec4(minValue, 0.0f, 0.0f, 0.0f),
																Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value0",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	m_attributes.push_back(AttribSpec("a_value1",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}